

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ReadFileBind<duckdb::ReadTextOperation>
          (ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  MultiFileList *pMVar1;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
  multi_file_reader;
  templated_unique_single_t result;
  value_type *in_stack_fffffffffffffde8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe08;
  LogicalTypeId LVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  LogicalType *in_stack_fffffffffffffe10;
  LogicalType *this;
  undefined8 in_stack_fffffffffffffe30;
  FileGlobOptions options;
  Value *in_stack_fffffffffffffe38;
  ClientContext *in_stack_fffffffffffffe40;
  allocator *paVar4;
  TableFunction *in_stack_fffffffffffffe48;
  allocator local_169;
  string local_168 [63];
  LogicalType local_129 [2];
  allocator local_e9;
  string local_e8 [63];
  allocator local_a9;
  string local_a8 [72];
  undefined1 local_60 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  
  LVar3 = (LogicalTypeId)((ulong)in_stack_fffffffffffffe08 >> 0x38);
  options = (FileGlobOptions)((ulong)in_stack_fffffffffffffe30 >> 0x38);
  local_28 = in_R8;
  make_uniq<duckdb::ReadFileBindData>();
  MultiFileReader::Create(in_stack_fffffffffffffe48);
  unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
  operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
              *)in_stack_fffffffffffffdf0);
  vector<duckdb::Value,_true>::operator[]
            ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffdf0,
             (size_type)in_stack_fffffffffffffde8);
  MultiFileReader::CreateFileList
            ((MultiFileReader *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38,options);
  pMVar1 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                     ((shared_ptr<duckdb::MultiFileList,_true> *)in_stack_fffffffffffffdf0);
  (*pMVar1->_vptr_MultiFileList[4])(local_60);
  unique_ptr<duckdb::ReadFileBindData,_std::default_delete<duckdb::ReadFileBindData>,_true>::
  operator->((unique_ptr<duckdb::ReadFileBindData,_std::default_delete<duckdb::ReadFileBindData>,_true>
              *)in_stack_fffffffffffffdf0);
  vector<duckdb::OpenFileInfo,_true>::operator=
            ((vector<duckdb::OpenFileInfo,_true> *)in_stack_fffffffffffffdf0,
             (vector<duckdb::OpenFileInfo,_true> *)in_stack_fffffffffffffde8);
  vector<duckdb::OpenFileInfo,_true>::~vector((vector<duckdb::OpenFileInfo,_true> *)0x14a7b01);
  shared_ptr<duckdb::MultiFileList,_true>::~shared_ptr
            ((shared_ptr<duckdb::MultiFileList,_true> *)0x14a7b0e);
  LogicalType::LogicalType(in_stack_fffffffffffffe10,LVar3);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
  LogicalType::~LogicalType((LogicalType *)0x14a7b50);
  paVar4 = &local_a9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_a8,"filename",paVar4);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ::std::__cxx11::string::~string(local_a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  ReadTextOperation::TYPE();
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
  LogicalType::~LogicalType((LogicalType *)0x14a7bf5);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_e8,"content",&local_e9);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ::std::__cxx11::string::~string(local_e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  LogicalType::LogicalType(in_stack_fffffffffffffe10,LVar3);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
  LogicalType::~LogicalType((LogicalType *)0x14a7c9f);
  this = local_129;
  pvVar2 = local_28;
  ::std::allocator<char>::allocator();
  LVar3 = (LogicalTypeId)((ulong)pvVar2 >> 0x38);
  ::std::__cxx11::string::string((string *)&local_129[0].physical_type_,"size",(allocator *)this);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ::std::__cxx11::string::~string((string *)&local_129[0].physical_type_);
  ::std::allocator<char>::~allocator((allocator<char> *)local_129);
  LogicalType::LogicalType(this,LVar3);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
  LogicalType::~LogicalType((LogicalType *)0x14a7d49);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_168,"last_modified",&local_169);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_28,in_stack_fffffffffffffde8);
  ::std::__cxx11::string::~string(local_168);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::ReadFileBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             local_28,(unique_ptr<duckdb::ReadFileBindData,_std::default_delete<duckdb::ReadFileBindData>_>
                       *)in_stack_fffffffffffffde8);
  unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
  ~unique_ptr((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               *)0x14a7dd3);
  unique_ptr<duckdb::ReadFileBindData,_std::default_delete<duckdb::ReadFileBindData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ReadFileBindData,_std::default_delete<duckdb::ReadFileBindData>,_true>
               *)0x14a7de0);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ReadFileBind(ClientContext &context, TableFunctionBindInput &input,
                                             vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<ReadFileBindData>();

	auto multi_file_reader = MultiFileReader::Create(input.table_function);
	result->files =
	    multi_file_reader->CreateFileList(context, input.inputs[0], FileGlobOptions::ALLOW_EMPTY)->GetAllFiles();

	return_types.push_back(LogicalType::VARCHAR);
	names.push_back("filename");
	return_types.push_back(OP::TYPE());
	names.push_back("content");
	return_types.push_back(LogicalType::BIGINT);
	names.push_back("size");
	return_types.push_back(LogicalType::TIMESTAMP_TZ);
	names.push_back("last_modified");

	return std::move(result);
}